

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::growGlobalUniformBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *newTypeList)

{
  _Rb_tree_header *p_Var1;
  TTypeList *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  HlslParseContext *this_00;
  
  this_00 = (HlslParseContext *)memberType;
  iVar3 = (*memberType->_vptr_TType[10])();
  correctUniform(this_00,(TQualifier *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*memberType->_vptr_TType[0x25])(memberType);
  if ((char)iVar3 != '\0') {
    iVar3 = (*memberType->_vptr_TType[0x25])(memberType);
    if ((char)iVar3 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    pTVar2 = (memberType->field_13).structure;
    p_Var1 = &(this->ioTypeMap).
              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->ioTypeMap).
             super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0;
        p_Var5 = (&p_Var5->_M_left)[*(TTypeList **)(p_Var5 + 1) < pTVar2]) {
      if (*(TTypeList **)(p_Var5 + 1) >= pTVar2) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var5 = p_Var4, pTVar2 < *(TTypeList **)(p_Var4 + 1))) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      p_Var5 = p_Var5[1]._M_right;
      goto LAB_00407357;
    }
  }
  p_Var5 = (_Base_ptr)0x0;
LAB_00407357:
  TParseContextBase::growGlobalUniformBlock
            (&this->super_TParseContextBase,loc,memberType,memberName,(TTypeList *)p_Var5);
  return;
}

Assistant:

void HlslParseContext::growGlobalUniformBlock(const TSourceLoc& loc, TType& memberType, const TString& memberName,
                                              TTypeList* newTypeList)
{
    newTypeList = nullptr;
    correctUniform(memberType.getQualifier());
    if (memberType.isStruct()) {
        auto it = ioTypeMap.find(memberType.getStruct());
        if (it != ioTypeMap.end() && it->second.uniform)
            newTypeList = it->second.uniform;
    }
    TParseContextBase::growGlobalUniformBlock(loc, memberType, memberName, newTypeList);
}